

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O3

void __thiscall
vkt::texture::util::TextureRenderer::renderQuad
          (TextureRenderer *this,Surface *result,int texUnit,float *texCoord,ReferenceParams *params
          )

{
  renderQuad(this,result,(float *)&DAT_00b593c0,texUnit,texCoord,params,1.0);
  return;
}

Assistant:

void TextureRenderer::renderQuad (tcu::Surface& result, int texUnit, const float* texCoord, const ReferenceParams& params)
{
	const float	maxAnisotropy = 1.0f;
	float		positions[]	=
	{
		-1.0,	-1.0f,	0.0f,	1.0f,
		-1.0f,	+1.0f,	0.0f,	1.0f,
		+1.0f,	-1.0f,	0.0f,	1.0f,
		+1.0f,	+1.0f,	0.0f,	1.0f
	};
	renderQuad(result, positions, texUnit, texCoord, params, maxAnisotropy);
}